

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-app.h
# Opt level: O2

void __thiscall
mp::SolverApp<MultiObjTestSolver<2>,_MockNLReader<MultiObjTestSolver<2>_>_>::ReadNL
          (SolverApp<MultiObjTestSolver<2>,_MockNLReader<MultiObjTestSolver<2>_>_> *this,
          int nl_reader_flags)

{
  SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>
  *pSVar1;
  Argument1 gmock_a1;
  MockProblemBuilder *this_00;
  SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>
  *this_01;
  double read_time;
  time_point start;
  double local_58;
  time_point local_50;
  _Any_data local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_50.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  this_00 = (MockProblemBuilder *)operator_new(0x1c48);
  MockProblemBuilder::MockProblemBuilder(this_00);
  std::__uniq_ptr_impl<MultiObjMockProblemBuilder,_std::default_delete<MultiObjMockProblemBuilder>_>
  ::reset((__uniq_ptr_impl<MultiObjMockProblemBuilder,_std::default_delete<MultiObjMockProblemBuilder>_>
           *)&this->builder_,(pointer)this_00);
  this_01 = (SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>
             *)operator_new(0x88);
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_38 = 0;
  uStack_30 = 0;
  internal::
  SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>
  ::SolverNLHandlerImpl
            (this_01,(this->builder_)._M_t.
                     super___uniq_ptr_impl<MultiObjMockProblemBuilder,_std::default_delete<MultiObjMockProblemBuilder>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_MultiObjMockProblemBuilder_*,_std::default_delete<MultiObjMockProblemBuilder>_>
                     .super__Head_base<0UL,_MultiObjMockProblemBuilder_*,_false>._M_head_impl,
             &this->solver_,(function<void_()> *)&local_48);
  pSVar1 = (this->handler_)._M_t.
           super___uniq_ptr_impl<mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>,_std::default_delete<mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>_*,_std::default_delete<mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>_>_>
           .
           super__Head_base<0UL,_mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>_*,_false>
           ._M_head_impl;
  (this->handler_)._M_t.
  super___uniq_ptr_impl<mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>,_std::default_delete<mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>_*,_std::default_delete<mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>_>_>
  .
  super__Head_base<0UL,_mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>_*,_false>
  ._M_head_impl = this_01;
  if (pSVar1 != (SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>
                 *)0x0) {
    (**(code **)((long)(pSVar1->super_NLProblemBuilder<MultiObjMockProblemBuilder>).
                       _vptr_NLProblemBuilder + 8))();
  }
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  gmock_a1.data_ = (this->nl_filename)._M_dataplus._M_p;
  gmock_a1.size_ = (this->nl_filename)._M_string_length;
  MockNLReader<MultiObjTestSolver<2>_>::DoRead
            (&this->super_MockNLReader<MultiObjTestSolver<2>_>,gmock_a1,
             (this->handler_)._M_t.
             super___uniq_ptr_impl<mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>,_std::default_delete<mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>_*,_std::default_delete<mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>_>_>
             .
             super__Head_base<0UL,_mp::internal::SolverNLHandlerImpl<MultiObjTestSolver<2>,_MultiObjMockProblemBuilder,_mp::internal::NLProblemBuilder<MultiObjMockProblemBuilder>_>_*,_false>
             ._M_head_impl,nl_reader_flags);
  local_58 = GetTimeAndReset(&local_50);
  if ((this->solver_).super_SolverImpl<MultiObjMockProblemBuilder>.super_Solver.super_BasicSolver.
      timing_ != 0) {
    BasicSolver::Print<double>((BasicSolver *)&this->solver_,(CStringRef)0x1df5b4,&local_58);
  }
  return;
}

Assistant:

void SolverApp<Solver, Reader>::ReadNL(int nl_reader_flags) {
  std::chrono::steady_clock::time_point start = std::chrono::steady_clock::now();

  builder_.reset(new ProblemBuilder(solver_));
  handler_.reset(new internal::SolverNLHandler<Solver>(*builder_, solver_));
  this->Read(nl_filename, *handler_, nl_reader_flags);

  double read_time = GetTimeAndReset(start);
  if (solver_.timing())
    solver_.Print("Input time = {:.6f}s\n", read_time);
}